

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  uVar6 = p->vCos->nSize - p->nRegs;
  if ((uVar6 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xbce,"Gia_Man_t *Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar10->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ea8e8;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar18 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) {
LAB_001ea907:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar11 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar11)) goto LAB_001ea907;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar11 - (long)pGVar5) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar10 = p->vCis;
    } while (lVar17 < pVVar10->nSize);
  }
  iVar7 = p->nObjs;
  if (0 < iVar7) {
    lVar19 = 8;
    lVar17 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar18 = *(ulong *)((long)pGVar4 + lVar19 + -8);
      if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
        uVar1 = *(uint *)((long)pGVar4 +
                         lVar19 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar16 = *(uint *)((long)pGVar4 +
                              lVar19 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar16 < 0)) goto LAB_001ea926;
        iVar7 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar18 >> 0x1d) & 1,
                               uVar16 ^ (uint)(uVar18 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar19) = iVar7;
        iVar7 = p->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar17 < iVar7);
  }
  iVar7 = p->nRegs;
  pVVar10 = p->vCos;
  iVar14 = pVVar10->nSize;
  iVar13 = iVar14 - iVar7;
  if (iVar13 != 0 && iVar7 <= iVar14) {
    lVar17 = (long)((int)uVar6 / 2);
    uVar18 = 0;
    do {
      if ((long)iVar14 <= (long)uVar18) goto LAB_001ea945;
      iVar2 = pVVar10->pArray[uVar18];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001ea8e8;
      if (((uint)((int)uVar6 / 2) == uVar18) || (pGVar4 = p->pObjs, pGVar4 == (Gia_Obj_t *)0x0))
      break;
      if (iVar13 <= lVar17) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar6 < -1) || (iVar14 <= lVar17)) goto LAB_001ea945;
      uVar1 = pVVar10->pArray[lVar17];
      if (((long)(int)uVar1 < 0) || ((uint)p->nObjs <= uVar1)) goto LAB_001ea8e8;
      uVar15 = (uint)*(undefined8 *)(pGVar4 + iVar2);
      uVar16 = (pGVar4 + iVar2)[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar16 < 0) goto LAB_001ea926;
      Gia_ManAppendCo(p_00,uVar15 >> 0x1d & 1 ^ uVar16);
      uVar16 = (uint)*(undefined8 *)(pGVar4 + (int)uVar1);
      uVar1 = (pGVar4 + (int)uVar1)[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001ea926;
      Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar1);
      uVar18 = uVar18 + 1;
      iVar7 = p->nRegs;
      pVVar10 = p->vCos;
      iVar14 = pVVar10->nSize;
      iVar13 = iVar14 - iVar7;
      lVar17 = lVar17 + 1;
    } while ((long)uVar18 < (long)iVar13);
  }
  if (0 < iVar7) {
    iVar14 = 0;
    do {
      iVar13 = p->vCos->nSize;
      uVar6 = (iVar13 - iVar7) + iVar14;
      if (((int)uVar6 < 0) || (iVar13 <= (int)uVar6)) {
LAB_001ea945:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCos->pArray[uVar6];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001ea8e8:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar7;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001ea926:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar6;
      iVar14 = iVar14 + 1;
      iVar7 = p->nRegs;
    } while (iVar14 < iVar7);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}